

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Throw * __thiscall
wasm::Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name tag,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Throw *this_00;
  
  this_00 = MixedArena::alloc<wasm::Throw>(&this->wasm->allocator);
  (this_00->tag).super_IString.str._M_len = tag.super_IString.str._M_len;
  (this_00->tag).super_IString.str._M_str = tag.super_IString.str._M_str;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,args);
  Throw::finalize(this_00);
  return this_00;
}

Assistant:

Throw* makeThrow(Name tag, const T& args) {
    auto* ret = wasm.allocator.alloc<Throw>();
    ret->tag = tag;
    ret->operands.set(args);
    ret->finalize();
    return ret;
  }